

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O0

bool __thiscall cmCTestRunProcess::StartProcess(cmCTestRunProcess *this)

{
  cmsysProcess *pcVar1;
  bool bVar2;
  int iVar3;
  char **command;
  ulong uVar4;
  char *dir;
  rep_conflict timeout;
  bool local_a5;
  duration<double,_std::ratio<1L,_1L>_> local_70;
  value_type local_68 [3];
  value_type local_50;
  reference local_48;
  string *cl;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<const_char_*,_std::allocator<const_char_*>_> args;
  cmCTestRunProcess *this_local;
  
  args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range1);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->CommandLineStrings);
  cl = (string *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&this->CommandLineStrings);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&cl), bVar2) {
    local_48 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
    local_50 = (value_type)std::__cxx11::string::c_str();
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range1,&local_50);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  local_68[0] = (value_type)0x0;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range1,local_68);
  pcVar1 = this->Process;
  command = std::vector<const_char_*,_std::allocator<const_char_*>_>::data
                      ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range1);
  cmsysProcess_SetCommand(pcVar1,command);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    pcVar1 = this->Process;
    dir = (char *)std::__cxx11::string::c_str();
    cmsysProcess_SetWorkingDirectory(pcVar1,dir);
  }
  cmsysProcess_SetOption(this->Process,0,1);
  local_70 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
  bVar2 = std::chrono::operator>=(&this->TimeOut,&local_70);
  if (bVar2) {
    pcVar1 = this->Process;
    timeout = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&this->TimeOut);
    cmsysProcess_SetTimeout(pcVar1,timeout);
  }
  cmsysProcess_Execute(this->Process);
  iVar3 = cmsysProcess_GetState(this->Process);
  this->PipeState = iVar3;
  local_a5 = true;
  if (this->PipeState != 3) {
    local_a5 = this->PipeState == 4;
  }
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range1);
  return local_a5;
}

Assistant:

bool StartProcess()
  {
    std::vector<const char*> args;
    for (std::string const& cl : this->CommandLineStrings) {
      args.push_back(cl.c_str());
    }
    args.push_back(nullptr); // null terminate
    cmsysProcess_SetCommand(this->Process, args.data());
    if (!this->WorkingDirectory.empty()) {
      cmsysProcess_SetWorkingDirectory(this->Process,
                                       this->WorkingDirectory.c_str());
    }

    cmsysProcess_SetOption(this->Process, cmsysProcess_Option_HideWindow, 1);
    if (this->TimeOut >= cmDuration::zero()) {
      cmsysProcess_SetTimeout(this->Process, this->TimeOut.count());
    }
    cmsysProcess_Execute(this->Process);
    this->PipeState = cmsysProcess_GetState(this->Process);
    // if the process is running or exited return true
    return this->PipeState == cmsysProcess_State_Executing ||
      this->PipeState == cmsysProcess_State_Exited;
  }